

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O0

result_t * sequenceWrapper(result_t *__return_storage_ptr__,string *s,shared_ptr<Env> *envptr)

{
  bool bVar1;
  element_type *this;
  element_type *env_00;
  undefined1 local_630 [8];
  shared_ptr<SpadeArguments> args;
  undefined1 local_610 [8];
  Env env;
  args_t args_;
  shared_ptr<Env> *envptr_local;
  string *s_local;
  
  parse((string *)&env.field_0x5d8);
  Env::Env((Env *)local_610);
  std::make_shared<SpadeArguments>();
  this = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )local_630);
  SpadeArguments::parse_args(this,env._1496_4_,(char **)args_._0_8_);
  bVar1 = std::operator==(envptr,(nullptr_t)0x0);
  if (bVar1) {
    sequenceFunc(__return_storage_ptr__,(Env *)local_610,(shared_ptr<SpadeArguments> *)local_630);
  }
  else {
    env_00 = std::__shared_ptr_access<Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Env,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)envptr
                       );
    sequenceFunc(__return_storage_ptr__,env_00,(shared_ptr<SpadeArguments> *)local_630);
  }
  std::shared_ptr<SpadeArguments>::~shared_ptr((shared_ptr<SpadeArguments> *)local_630);
  Env::~Env((Env *)local_610);
  args_t::~args_t((args_t *)&env.field_0x5d8);
  return __return_storage_ptr__;
}

Assistant:

result_t sequenceWrapper(const string &s, shared_ptr<Env>& envptr) {
    args_t args_ = parse(s);
    Env env;
    shared_ptr<SpadeArguments> args = make_shared<SpadeArguments>();
    args->parse_args(args_.argc, args_.argv);
    if (envptr == nullptr) {
        return sequenceFunc(env, args);
    } else {
        return sequenceFunc(*envptr, args);
    }
}